

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O0

void oversubscription(size_t W)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  void *__stat_loc;
  ulong in_RDI;
  double __x;
  double __x_00;
  Expression_lhs<const_std::atomic<unsigned_long>_&> EVar2;
  Expression_lhs<const_unsigned_long> EVar3;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  size_t t;
  size_t l;
  Task curr;
  Task prev;
  size_t n;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  atomic<unsigned_long> counter;
  Executor executor;
  Taskflow taskflow;
  Task *in_stack_fffffffffffffb28;
  Result *pRVar4;
  Taskflow *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  Enum in_stack_fffffffffffffb3c;
  char *in_stack_fffffffffffffb40;
  Enum in_stack_fffffffffffffb4c;
  Taskflow *in_stack_fffffffffffffb50;
  Executor *this;
  anon_class_32_4_9abd1b3d *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  ExpressionDecomposer local_474;
  char *local_470;
  Enum local_468;
  unsigned_long *in_stack_fffffffffffffbb0;
  Expression_lhs<const_std::atomic<unsigned_long>_&> *in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffc18;
  size_t in_stack_fffffffffffffc20;
  Executor *in_stack_fffffffffffffc28;
  ExpressionDecomposer local_3ac;
  Taskflow *local_3a8;
  Enum local_3a0;
  ResultBuilder local_378;
  __basic_future<void> local_300 [2];
  ulong local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  Task local_2b8;
  ulong local_2b0;
  Task local_2a8;
  Task local_2a0;
  ulong local_298;
  undefined1 local_290 [56];
  undefined1 local_258 [40];
  undefined1 local_230 [24];
  Executor local_218;
  ulong local_8;
  
  local_8 = in_RDI;
  tf::Taskflow::Taskflow(in_stack_fffffffffffffb50);
  this = &local_218;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffc18);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11b7d5);
  memset(local_230,0,8);
  std::mutex::mutex((mutex *)0x11b7f6);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x11b803);
  for (local_298 = 0; local_298 < local_8 >> 1; local_298 = local_298 + 1) {
    tf::Task::Task(&local_2a0);
    tf::Task::Task(&local_2a8);
    for (local_2b0 = 0; local_2b0 < 100; local_2b0 = local_2b0 + 1) {
      local_2d8 = local_258;
      local_2d0 = local_290;
      local_2c8 = (undefined1 *)
                  ((long)&local_218._taskflows_mutex.super___mutex_base._M_mutex + 0x10);
      local_2c0 = local_230;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:863:31),_nullptr>
                ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb70);
      tf::Task::operator=(&local_2a8,&local_2b8);
      if (local_2b0 != 0) {
        tf::Task::succeed<tf::Task&>((Task *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      }
      tf::Task::operator=(&local_2a0,&local_2a8);
    }
  }
  local_2e0 = 1;
  while( true ) {
    if (100 < local_2e0) {
      std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
      ~unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )0x11bddb);
      tf::Executor::~Executor(this);
      tf::Taskflow::~Taskflow(in_stack_fffffffffffffb30);
      return;
    }
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::clear
              ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               0x11b9ae);
    __stat_loc = (void *)((long)&local_218._taskflows_mutex.super___mutex_base._M_mutex + 0x10);
    tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                      in_stack_fffffffffffffb30);
    std::__basic_future<void>::wait(local_300,__stat_loc);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffb30);
    pRVar4 = (Result *)0x18308d;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,(char *)in_stack_fffffffffffffb30
               ,"",(char *)this);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3ac,DT_REQUIRE);
    EVar2 = doctest::detail::ExpressionDecomposer::operator<<<std::atomic<unsigned_long>,_nullptr>
                      ((ExpressionDecomposer *)in_stack_fffffffffffffb30,
                       (atomic<unsigned_long> *)pRVar4);
    in_stack_fffffffffffffb50 = (Taskflow *)EVar2.lhs;
    in_stack_fffffffffffffb4c = EVar2.m_at;
    local_3a8 = in_stack_fffffffffffffb50;
    local_3a0 = in_stack_fffffffffffffb4c;
    doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
              (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffb30,pRVar4);
    doctest::detail::Result::~Result((Result *)0x11baed);
    doctest::detail::ResultBuilder::log(&local_378,__x);
    if ((extraout_AL & 1) != 0) break;
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffb30);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11bbe9);
    pRVar4 = (Result *)0x18308d;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
               in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,(char *)in_stack_fffffffffffffb30
               ,"",(char *)this);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_474,DT_REQUIRE);
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::size
              ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               0x11bc3f);
    EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                      ((ExpressionDecomposer *)in_stack_fffffffffffffb30,(unsigned_long *)pRVar4);
    in_stack_fffffffffffffb40 = (char *)EVar3.lhs;
    in_stack_fffffffffffffb3c = EVar3.m_at;
    local_470 = in_stack_fffffffffffffb40;
    local_468 = in_stack_fffffffffffffb3c;
    (((void)(((doctest::detail::declval<unsigned_long_const>)())<=((doctest::detail::
    declval<unsigned_long>)()))),doctest::detail::Result{})doctest::detail::
    Expression_lhs<unsigned_long_const>::operator<=
              ((Expression_lhs<const_unsigned_long> *)in_stack_fffffffffffffbb8,
               in_stack_fffffffffffffbb0);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffb30,pRVar4);
    doctest::detail::Result::~Result((Result *)0x11bcc6);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffbc0,__x_00);
    in_stack_fffffffffffffb38 = CONCAT13(extraout_AL_00,(int3)in_stack_fffffffffffffb38);
    if ((extraout_AL_00 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffb30);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11bda2);
    local_2e0 = local_2e0 + 1;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void oversubscription(size_t W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> counter{0};
  
  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  for(size_t n = 0; n<W/2; n++) { 
  
    tf::Task prev, curr;

    for(size_t l=0; l<100; l++) {

      curr = taskflow.emplace([&](){
        // record worker
        {
          std::scoped_lock lock(mutex);
          set.insert(executor.this_worker_id());
        }
        counter.fetch_add(1, std::memory_order_relaxed);
      });

      if(l) {
        curr.succeed(prev);
      }

      prev = curr;
    }
  }

  for(size_t t=1; t<=100; t++) {
    set.clear();
    executor.run(taskflow).wait();
    REQUIRE(counter == 100*(W/2)*t);
    REQUIRE(set.size() <= W/2);
  }
}